

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view.cpp
# Opt level: O0

void __thiscall
SStringView_OperatorWrite_Test::~SStringView_OperatorWrite_Test
          (SStringView_OperatorWrite_Test *this)

{
  SStringView_OperatorWrite_Test *this_local;
  
  ~SStringView_OperatorWrite_Test(this);
  ::operator_delete(this,0x10);
  return;
}

Assistant:

TEST (SStringView, OperatorWrite) {
    auto check = [] (std::string const & str) {
        auto view = pstore::make_sstring_view (str.data (), str.length ());
        std::ostringstream stream;
        stream << view;
        EXPECT_EQ (stream.str (), str);
    };
    check ("");
    check ("abcdef");
    check ("hello world");
}